

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

int __thiscall
Fl_Tree::item_pathname(Fl_Tree *this,char *pathname,int pathnamelen,Fl_Tree_Item *item)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  char *__s;
  int iVar6;
  char *pcVar7;
  
  *pathname = '\0';
  if (item == (Fl_Tree_Item *)0x0) {
    item = this->_root;
  }
  if (item == (Fl_Tree_Item *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = -2;
    if (1 < pathnamelen) {
      pcVar7 = pathname + ((ulong)(uint)pathnamelen - 2);
      pathname[(ulong)(uint)pathnamelen - 1] = '\0';
      iVar5 = 1;
      do {
        if ((item->_parent == (Fl_Tree_Item *)0x0) && ((this->_prefs)._showroot == '\0')) break;
        pcVar2 = Fl_Tree_Item::label(item);
        __s = "???";
        if (pcVar2 != (char *)0x0) {
          __s = Fl_Tree_Item::label(item);
        }
        sVar3 = strlen(__s);
        if (0 < (int)(uint)sVar3) {
          uVar4 = (ulong)((uint)sVar3 & 0x7fffffff) + 1;
          iVar6 = iVar5;
          do {
            iVar5 = iVar6 + 1;
            if (pathnamelen <= iVar5) goto LAB_001d9953;
            cVar1 = __s[uVar4 - 2];
            *pcVar7 = cVar1;
            if ((cVar1 == '\\') || (cVar1 == '/')) {
              iVar5 = iVar6 + 2;
              if (pathnamelen <= iVar5) goto LAB_001d9953;
              pcVar7[-1] = '\\';
              pcVar7 = pcVar7 + -2;
            }
            else {
              pcVar7 = pcVar7 + -1;
            }
            uVar4 = uVar4 - 1;
            iVar6 = iVar5;
          } while (1 < uVar4);
        }
        iVar5 = iVar5 + 1;
        if (pathnamelen <= iVar5) {
LAB_001d9953:
          *pathname = '\0';
          return -2;
        }
        *pcVar7 = '/';
        pcVar7 = pcVar7 + -1;
        item = item->_parent;
      } while (item != (Fl_Tree_Item *)0x0);
      pcVar2 = pcVar7 + 2;
      if (pcVar7[1] != '/') {
        pcVar2 = pcVar7 + 1;
      }
      if (pcVar2 != pathname) {
        memmove(pathname,pcVar2,(long)(int)(iVar5 - (uint)(pcVar7[1] == '/')));
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int Fl_Tree::item_pathname(char *pathname, int pathnamelen, const Fl_Tree_Item *item) const {
  pathname[0] = '\0';
  item = item ? item : _root;
  if ( !item ) return(-1);
  // Build pathname starting at end
  char *s = (pathname+pathnamelen-1);
  int slen = 0;			// length of string compiled so far (including NULL)
  SAFE_RCAT('\0');
  while ( item ) {
    if ( item->is_root() && showroot() == 0 ) break;		// don't include root in path if showroot() off
    // Find name of current item
    const char *name = item->label() ? item->label() : "???";	// name for this item
    int len = (int) strlen(name);
    // Add name to end of pathname[]
    for ( --len; len>=0; len-- ) {
      SAFE_RCAT(name[len]);					// rcat name of item
      if ( name[len] == '/' || name[len] == '\\' ) {
        SAFE_RCAT('\\');					// escape front or back slashes within name
      }
    }
    SAFE_RCAT('/');						// rcat leading slash
    item = item->parent();					// move up tree (NULL==root)
  }
  if ( *(++s) == '/' ) { ++s; --slen; }				// leave off leading slash from pathname
  if ( s != pathname ) memmove(pathname, s, slen);	// Shift down right-aligned string
  return(0);
}